

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void dereference_suite::overwrite_u16string(void)

{
  index_type *this;
  type v;
  reference this_00;
  nullable local_60 [4];
  undefined1 local_50 [8];
  iterator where;
  variable data;
  
  this = &where.
          super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
          .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)this,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)local_50,(basic_variable<std::allocator<char>_> *)this);
  this_00 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                      ((iterator *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=(this_00,null);
  local_60[0] = null;
  v = trial::dynamic::operator==
                ((basic_variable<std::allocator<char>_> *)
                 &where.
                  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  .current.current,local_60);
  boost::detail::test_impl
            ("data == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x871,"void dereference_suite::overwrite_u16string()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void overwrite_u16string()
{
    variable data(u"charlie");
    auto where = data.begin();
    *where = null;
    TRIAL_PROTOCOL_TEST(data == null);
}